

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pasteboard.c
# Opt level: O0

void wpe_pasteboard_string_vector_free(wpe_pasteboard_string_vector *vector)

{
  ulong local_18;
  uint64_t i;
  wpe_pasteboard_string_vector *vector_local;
  
  if (vector->strings != (wpe_pasteboard_string *)0x0) {
    for (local_18 = 0; local_18 < vector->length; local_18 = local_18 + 1) {
      wpe_pasteboard_string_free(vector->strings + local_18);
    }
    free(vector->strings);
  }
  vector->strings = (wpe_pasteboard_string *)0x0;
  vector->length = 0;
  return;
}

Assistant:

void
wpe_pasteboard_string_vector_free(struct wpe_pasteboard_string_vector* vector)
{
    if (vector->strings) {
        for (uint64_t i = 0; i < vector->length; ++i)
            wpe_pasteboard_string_free(&vector->strings[i]);
        wpe_free(vector->strings);
    }
    vector->strings = 0;
    vector->length = 0;
}